

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.c
# Opt level: O2

void translation_processLine
               (translation_module_t *translation_modules,FILE *out,csafestring_t *output,char *line
               )

{
  char cVar1;
  void *method;
  char *line_00;
  
  if (line == (char *)0x0) {
    if (*output->data != '\0') {
      fprintf((FILE *)out,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n");
      safe_emptyBuffer(output);
      return;
    }
  }
  else {
LAB_0010402e:
    while (line_00 = line, cVar1 = *line_00, cVar1 == '\t') {
LAB_0010405b:
      line = line_00 + 1;
      if ((line_00[1] != '\t') && (line_00[1] != ' ')) {
        if (cVar1 == '\t') {
          safe_strchrappend(output,' ');
        }
        else {
LAB_0010407e:
          method = modules_matches(translation_modules,line_00);
          if (method == (void *)0x0) {
            safe_strchrappend(output,*line_00);
LAB_001040fe:
            line = line_00 + 1;
          }
          else {
            if (*output->data != '\0') {
              fprintf((FILE *)out,"__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n")
              ;
              safe_emptyBuffer(output);
            }
            line = modules_execute(out,method,line_00);
          }
        }
      }
    }
    if (cVar1 == '\n') {
      line = line_00 + 1;
      if (line_00[1] == '\0') {
        safe_strchrappend(output,'\0');
      }
      goto LAB_0010402e;
    }
    if (cVar1 == ' ') goto LAB_0010405b;
    if (cVar1 == '\"') {
      safe_strcat(output,"\\\"");
      goto LAB_001040fe;
    }
    if (cVar1 != '\0') goto LAB_0010407e;
  }
  return;
}

Assistant:

static void translation_processLine(translation_module_t *translation_modules, FILE *out, csafestring_t *output, char *line) {
	void *method;

	if ( line == NULL ) {
		if ( output->data[0] != '\0' ) {
			fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", output->data);
			safe_emptyBuffer(output);
		}
		return;
	}
	
	while ( *line != '\0' ) {
		if ( *line == '\n' && *( line + 1 ) == '\0' ) {
			safe_strchrappend(output, '\0');
			line++;
		} else if ( *line == '\n' ) {
			line++;
		} else if ( ( *line == ' ' || *line == '\t' ) && ( *( line + 1 ) == ' ' || *( line + 1 ) == '\t' ) ) {
			line++;
		} else if ( *line == '\t' ) {
			safe_strchrappend(output, ' ');
			line++;
		} else if ( *line == '\"' ) {
			safe_strcat(output, "\\\"");
			line++;
		} else {
			method = modules_matches(translation_modules, line);
			if ( method != NULL ) {
				if ( output->data[0] != '\0' ) {
					fprintf(out, "__internal_hfunction->safe_strcat(__internal_string, \"%s\");\n", output->data);
					safe_emptyBuffer(output);
				}
				line = modules_execute(out, method, line);
			} else {
				safe_strchrappend(output, *line);
				line++;
			}
		}
	}
}